

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O0

Status __thiscall
ot::commissioner::persistent_storage::Registry::GetNetworkByName
          (Registry *this,string *aName,Network *aRet)

{
  Status SVar1;
  undefined1 local_80 [8];
  Network nwk;
  Network *aRet_local;
  string *aName_local;
  Registry *this_local;
  
  nwk._88_8_ = aRet;
  Network::Network((Network *)local_80);
  std::__cxx11::string::operator=((string *)&nwk,(string *)aName);
  SVar1 = LookupOne(this,(Network *)local_80,(Network *)nwk._88_8_);
  Network::~Network((Network *)local_80);
  return SVar1;
}

Assistant:

Registry::Status Registry::GetNetworkByName(const std::string &aName, Network &aRet)
{
    Network nwk{};
    nwk.mName = aName;
    return LookupOne(nwk, aRet);
}